

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.h
# Opt level: O0

Name __thiscall wasm::TranslateToFuzzReader::makeLabel(TranslateToFuzzReader *this)

{
  uint __val;
  string local_98;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"label$",&local_61);
  __val = this->funcContext->labelIndex;
  this->funcContext->labelIndex = __val + 1;
  std::__cxx11::to_string(&local_98,__val);
  std::operator+(&local_40,&local_60,&local_98);
  Name::Name((Name *)&this_local,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return (IString)(IString)_this_local;
}

Assistant:

Name makeLabel() {
    return std::string("label$") + std::to_string(funcContext->labelIndex++);
  }